

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoordCalc.cpp
# Opt level: O3

positionTy * __thiscall positionTy::deg2rad(positionTy *__return_storage_ptr__,positionTy *this)

{
  undefined1 *puVar1;
  double dVar2;
  double dVar3;
  long lVar4;
  positionTy *ppVar5;
  positionTy *ppVar6;
  ulong uVar7;
  ulong uVar8;
  undefined1 auVar9 [16];
  
  ppVar5 = this;
  ppVar6 = __return_storage_ptr__;
  for (lVar4 = 9; lVar4 != 0; lVar4 = lVar4 + -1) {
    ppVar6->_lat = ppVar5->_lat;
    ppVar5 = (positionTy *)&ppVar5->_lon;
    ppVar6 = (positionTy *)&ppVar6->_lon;
  }
  if (((this->f).field_0x1 & 8) == 0) {
    dVar2 = this->_lat;
    dVar3 = this->_lon;
    uVar7 = -(ulong)(dVar2 <= (double)DAT_00246830);
    uVar8 = -(ulong)(dVar3 <= DAT_00246830._8_8_);
    auVar9._0_8_ = (double)(~uVar7 & (ulong)(dVar2 + -360.0) | (ulong)dVar2 & uVar7) *
                   3.141592653589793;
    auVar9._8_8_ = (double)(~uVar8 & (ulong)(dVar3 + -360.0) | (ulong)dVar3 & uVar8) *
                   3.141592653589793;
    auVar9 = divpd(auVar9,_DAT_00246830);
    __return_storage_ptr__->_lat = (double)auVar9._0_8_;
    __return_storage_ptr__->_lon = (double)auVar9._8_8_;
    puVar1 = &(__return_storage_ptr__->f).field_0x1;
    *puVar1 = *puVar1 | 8;
  }
  return __return_storage_ptr__;
}

Assistant:

positionTy positionTy::deg2rad() const
{
    positionTy ret(*this);                  // copy position
    if (f.unitAngle == UNIT_DEG) {          // if DEG convert to RAD
        ret.lat() = ::deg2rad(lat());
        ret.lon() = ::deg2rad(lon());
        ret.f.unitAngle = UNIT_RAD;
    }
    return ret;
}